

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void dtranspose(double *sig,int rows,int cols,double *col)

{
  int local_30;
  int local_2c;
  int k;
  int i;
  int ud;
  int max;
  double *col_local;
  int cols_local;
  int rows_local;
  double *sig_local;
  
  i = rows;
  if (cols <= rows) {
    i = cols;
  }
  k = 0;
  local_2c = -rows;
  while (local_2c = local_2c + 1, local_2c < cols) {
    if (local_2c < 1) {
      k = k + 1;
      if (i <= k) {
        k = i;
      }
      for (local_30 = 0; local_30 < k; local_30 = local_30 + 1) {
        col[(local_30 * rows + local_30) - local_2c] = sig[(local_30 - local_2c) * cols + local_30];
      }
    }
    else {
      if ((0 < (local_2c - cols) + rows) && (k = k + -1, i <= k)) {
        k = i;
      }
      for (local_30 = 0; local_30 < k; local_30 = local_30 + 1) {
        col[(local_30 + local_2c) * rows + local_30] = sig[local_30 * cols + local_30 + local_2c];
      }
    }
  }
  return;
}

Assistant:

void dtranspose(double *sig, int rows, int cols,double *col) {
    int max,ud,i,k;
    if (rows >= cols) {
    	max = cols;
    } else {
    	max = rows;
    }
    ud = 0;
	for (i= -rows + 1; i < cols; i++) {
		if (i <= 0) {
			ud++;
			if (ud >= max)
				ud = max;
			for (k = 0; k < ud; k++) {
				col[k*rows+k-i] = sig[(k-i)*cols+k];
			}
		} else {
			if (i - cols + rows > 0) {
				ud--;
				if (ud >= max)
					ud = max;
			}
			for (k = 0; k < ud; k++) {
				col[(k+i)*rows+k] = sig[k*cols+k+i];
			}
		}

	}

}